

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t encoder_nop_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  
  if (size == 0) {
    __n = 0xfffffffffffffffe;
  }
  else {
    sVar2 = (part->encstate).bufbeg;
    sVar1 = (part->encstate).bufend;
    __n = sVar1 - sVar2;
    if (size <= __n) {
      __n = size;
    }
    if (sVar1 != sVar2) {
      memcpy(buffer,(part->encstate).buf + sVar2,__n);
      sVar2 = (part->encstate).bufbeg;
    }
    (part->encstate).bufbeg = sVar2 + __n;
  }
  return __n;
}

Assistant:

static size_t encoder_nop_read(char *buffer, size_t size, bool ateof,
                               struct curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t insize = st->bufend - st->bufbeg;

  (void) ateof;

  if(!size)
    return STOP_FILLING;

  if(size > insize)
    size = insize;

  if(size)
    memcpy(buffer, st->buf + st->bufbeg, size);

  st->bufbeg += size;
  return size;
}